

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

uint32_t __thiscall Cache::getId(Cache *this,uint32_t addr)

{
  uint32_t uVar1;
  uint32_t uVar2;
  Cache *this_00;
  
  this_00 = this;
  uVar1 = log2i(this,(this->policy).blockSize);
  uVar2 = log2i(this_00,(this->policy).blockNum / (this->policy).associativity);
  return addr >> ((byte)uVar1 & 0x1f) & ~(-1 << ((byte)uVar2 & 0x1f));
}

Assistant:

uint32_t Cache::getId(uint32_t addr) {
  uint32_t offsetBits = log2i(policy.blockSize);
  uint32_t idBits = log2i(policy.blockNum / policy.associativity);
  uint32_t mask = (1 << idBits) - 1;
  return (addr >> offsetBits) & mask;
}